

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::Shortcut(ImGuiKeyChord key_chord,ImGuiID owner_id,ImGuiInputFlags flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiKey IVar3;
  uint flags_00;
  ImGuiKey key;
  uint uVar4;
  
  pIVar1 = GImGui;
  flags_00 = flags | 0x100;
  if ((flags & 0xf00U) != 0) {
    flags_00 = flags;
  }
  bVar2 = SetShortcutRouting(key_chord,owner_id,flags_00);
  if ((bVar2) && (IVar3 = key_chord & ImGuiMod_Mask_, (pIVar1->IO).KeyMods == IVar3)) {
    key = key_chord & ~ImGuiMod_Mask_;
    if (((key_chord & ~ImGuiMod_Mask_) == ImGuiKey_KeysData_OFFSET) &&
       ((key = IVar3, key_chord - 0x1000U < 0x8000 &&
        (uVar4 = key_chord - 0x1000U >> 0xc, (0x8bU >> (uVar4 & 0x1f) & 1) != 0)))) {
      key = *(ImGuiKey *)(&DAT_0025ef70 + (ulong)uVar4 * 4);
    }
    bVar2 = IsKeyPressed(key,owner_id,flags_00 & 0xf);
    return bVar2;
  }
  return false;
}

Assistant:

bool ImGui::Shortcut(ImGuiKeyChord key_chord, ImGuiID owner_id, ImGuiInputFlags flags)
{
    ImGuiContext& g = *GImGui;

    // When using (owner_id == 0/Any): SetShortcutRouting() will use CurrentFocusScopeId and filter with this, so IsKeyPressed() is fine with he 0/Any.
    if ((flags & ImGuiInputFlags_RouteMask_) == 0)
        flags |= ImGuiInputFlags_RouteFocused;
    if (!SetShortcutRouting(key_chord, owner_id, flags))
        return false;

    ImGuiKey key = (ImGuiKey)(key_chord & ~ImGuiMod_Mask_);
    ImGuiKey mods = (ImGuiKey)(key_chord & ImGuiMod_Mask_);
    if (g.IO.KeyMods != mods)
        return false;

    // Special storage location for mods
    if (key == ImGuiKey_None)
        key = ConvertSingleModFlagToKey(mods);

    if (!IsKeyPressed(key, owner_id, (flags & (ImGuiInputFlags_Repeat | ImGuiInputFlags_RepeatRateMask_))))
        return false;
    IM_ASSERT((flags & ~ImGuiInputFlags_SupportedByShortcut) == 0); // Passing flags not supported by this function!

    return true;
}